

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t ComputeShortestPathFromNodes(size_t num_bytes,ZopfliNode *nodes)

{
  uint uVar1;
  bool bVar2;
  size_t len;
  size_t num_commands;
  size_t index;
  ZopfliNode *nodes_local;
  size_t num_bytes_local;
  
  len = 0;
  num_commands = num_bytes;
  while( true ) {
    bVar2 = false;
    if ((nodes[num_commands].dcode_insert_length & 0x7ffffff) == 0) {
      bVar2 = nodes[num_commands].length == 1;
    }
    if (!bVar2) break;
    num_commands = num_commands - 1;
  }
  nodes[num_commands].u.next = 0xffffffff;
  while (num_commands != 0) {
    uVar1 = (nodes[num_commands].length & 0x1ffffff) +
            (nodes[num_commands].dcode_insert_length & 0x7ffffff);
    num_commands = num_commands - uVar1;
    nodes[num_commands].u.next = uVar1;
    len = len + 1;
  }
  return len;
}

Assistant:

static size_t ComputeShortestPathFromNodes(size_t num_bytes,
    ZopfliNode* nodes) {
  size_t index = num_bytes;
  size_t num_commands = 0;
  while ((nodes[index].dcode_insert_length & 0x7FFFFFF) == 0 &&
      nodes[index].length == 1) --index;
  nodes[index].u.next = BROTLI_UINT32_MAX;
  while (index != 0) {
    size_t len = ZopfliNodeCommandLength(&nodes[index]);
    index -= len;
    nodes[index].u.next = (uint32_t)len;
    num_commands++;
  }
  return num_commands;
}